

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l1x.cpp
# Opt level: O2

uint16_t VL53L1X::encodeTimeout(uint32_t timeout_mclks)

{
  uint uVar1;
  short sVar2;
  
  if (timeout_mclks != 0) {
    sVar2 = 0;
    for (uVar1 = timeout_mclks - 1; 0xff < uVar1; uVar1 = uVar1 >> 1) {
      sVar2 = sVar2 + 0x100;
    }
    return (short)uVar1 + sVar2;
  }
  return 0;
}

Assistant:

uint16_t VL53L1X::encodeTimeout(uint32_t timeout_mclks)
{
  // encoded format: "(LSByte * 2^MSByte) + 1"

  uint32_t ls_byte = 0;
  uint16_t ms_byte = 0;

  if (timeout_mclks > 0)
  {
    ls_byte = timeout_mclks - 1;

    while ((ls_byte & 0xFFFFFF00) > 0)
    {
      ls_byte >>= 1;
      ms_byte++;
    }

    return (ms_byte << 8) | (ls_byte & 0xFF);
  }
  else { return 0; }
}